

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCppFile.h
# Opt level: O1

void __thiscall cppforth::Forth::fileReposition(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  uint uVar1;
  _Ios_Seekdir _Var2;
  shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> f;
  long *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  requireDStackDepth(this,3,"REPOSITION-FILE");
  this_00 = &this->dStack;
  uVar1 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  _Var2 = ForthStack<unsigned_int>::getTop(this_00,1);
  ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"REPOSITION-FILE","");
  GetFileHandle((Forth *)&local_60,(Cell)this,(string *)(ulong)uVar1,(errorCodes)local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  std::ios::clear((int)local_60 + (int)*(undefined8 *)(*local_60 + -0x18));
  std::istream::seekg((long)local_60,_Var2);
  ForthStack<unsigned_int>::setTop
            (this_00,-(*(uint *)((long)local_60 + *(long *)(*local_60 + -0x18) + 0x20) & 1) &
                     0xffffffbf);
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  return;
}

Assistant:

void fileReposition() {
	REQUIRE_DSTACK_DEPTH(3, "REPOSITION-FILE");
	auto h = (dStack.getTop()); dStack.pop();
	DCell ud(dStack.getTop(1), dStack.getTop()); dStack.pop();
	auto f = GetFileHandle(h, "REPOSITION-FILE", errorFilePosition);
	f->clear();
	f->seekg(ud.data_.Dcells , std::ios_base::beg);
	auto status = f->rdstate();
	dStack.setTop(f->bad() ? Cell(errorFilePosition) : 0);
}